

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O1

ze_result_t validation_layer::zeInit(ze_init_flags_t flags)

{
  long lVar1;
  code *pcVar2;
  long lVar3;
  undefined8 *puVar4;
  long *plVar5;
  ze_result_t zVar6;
  ze_result_t result;
  long lVar7;
  ulong uVar8;
  ze_result_t unaff_EBP;
  ulong uVar9;
  bool bVar10;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar7 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"zeInit(flags)","");
  if (*(char *)(lVar7 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar7 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar2 = *(code **)(context + 0x90);
  if (pcVar2 == (code *)0x0) {
    zVar6 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar7 = *(long *)(context + 0xd30);
    lVar3 = *(long *)(context + 0xd38);
    uVar9 = lVar3 - lVar7 >> 3;
    bVar10 = lVar3 != lVar7;
    if (bVar10) {
      uVar8 = 1;
      do {
        puVar4 = (undefined8 *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar8 * 8);
        zVar6 = (**(code **)*puVar4)(puVar4,flags);
        if (zVar6 != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeInit",zVar6);
          unaff_EBP = zVar6;
          break;
        }
        bVar10 = uVar8 < uVar9;
        lVar1 = (-(ulong)(uVar9 == 0) - uVar9) + uVar8;
        uVar8 = uVar8 + 1;
      } while (lVar1 != 0);
    }
    if (bVar10) {
      return unaff_EBP;
    }
    zVar6 = (*pcVar2)(flags);
    bVar10 = lVar3 != lVar7;
    if (bVar10) {
      uVar8 = 1;
      do {
        plVar5 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar8 * 8);
        result = (**(code **)(*plVar5 + 8))(plVar5,flags,zVar6);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeInit",result);
          unaff_EBP = result;
          break;
        }
        bVar10 = uVar8 < uVar9;
        lVar7 = (-(ulong)(uVar9 == 0) - uVar9) + uVar8;
        uVar8 = uVar8 + 1;
      } while (lVar7 != 0);
    }
    if (bVar10) {
      return unaff_EBP;
    }
  }
  logAndPropagateResult("zeInit",zVar6);
  return zVar6;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeInit(
        ze_init_flags_t flags                           ///< [in] initialization flags.
                                                        ///< must be 0 (default) or a combination of ::ze_init_flag_t.
        )
    {
        context.logger->log_trace("zeInit(flags)");

        auto pfnInit = context.zeDdiTable.Global.pfnInit;

        if( nullptr == pfnInit )
            return logAndPropagateResult("zeInit", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeInitPrologue( flags );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeInit", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeInitPrologue( flags );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeInit", result);
        }

        auto driver_result = pfnInit( flags );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeInitEpilogue( flags ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeInit", result);
        }

        return logAndPropagateResult("zeInit", driver_result);
    }